

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_intrin_sse2.c
# Opt level: O0

void hadamard_col8_sse2(__m128i *in,int iter)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  int in_ESI;
  short *in_RDI;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar25;
  short sVar26;
  short sVar27;
  short sVar28;
  short sVar29;
  short sVar30;
  short sVar31;
  short sVar32;
  short sVar33;
  short sVar34;
  short sVar35;
  short sVar36;
  short sVar37;
  short sVar38;
  short sVar39;
  short sVar40;
  short sVar41;
  short sVar42;
  short sVar43;
  short sVar44;
  short sVar45;
  short sVar46;
  short sVar47;
  short sVar48;
  short sVar49;
  short sVar50;
  short sVar51;
  short sVar52;
  short sVar53;
  short sVar54;
  short sVar55;
  short sVar56;
  short sVar57;
  short sVar58;
  short sVar59;
  short sVar60;
  short sVar61;
  short sVar62;
  short sVar63;
  short sVar64;
  short sVar65;
  short sVar66;
  short sVar67;
  short sVar68;
  short sVar69;
  short sVar70;
  short sVar71;
  short sVar72;
  short sVar73;
  short sVar74;
  short sVar75;
  short sVar76;
  short sVar77;
  short sVar78;
  short sVar79;
  short sVar80;
  __m128i a7;
  __m128i a6;
  __m128i a5;
  __m128i a4;
  __m128i a3;
  __m128i a2;
  __m128i a1;
  __m128i a0;
  undefined4 local_788;
  undefined4 uStack_780;
  undefined4 local_768;
  undefined4 uStack_760;
  undefined4 local_748;
  undefined4 uStack_740;
  undefined4 local_728;
  undefined4 uStack_720;
  short local_588;
  short sStack_586;
  short sStack_584;
  short sStack_582;
  short sStack_580;
  short sStack_57e;
  short sStack_57c;
  short sStack_57a;
  short local_578;
  short sStack_576;
  short sStack_574;
  short sStack_572;
  short sStack_570;
  short sStack_56e;
  short sStack_56c;
  short sStack_56a;
  short local_568;
  short sStack_566;
  short sStack_564;
  short sStack_562;
  short sStack_560;
  short sStack_55e;
  short sStack_55c;
  short sStack_55a;
  short local_558;
  short sStack_556;
  short sStack_554;
  short sStack_552;
  short sStack_550;
  short sStack_54e;
  short sStack_54c;
  short sStack_54a;
  short local_548;
  short sStack_546;
  short sStack_544;
  short sStack_542;
  short sStack_540;
  short sStack_53e;
  short sStack_53c;
  short sStack_53a;
  short local_538;
  short sStack_536;
  short sStack_534;
  short sStack_532;
  short sStack_530;
  short sStack_52e;
  short sStack_52c;
  short sStack_52a;
  short local_528;
  short sStack_526;
  short sStack_524;
  short sStack_522;
  short sStack_520;
  short sStack_51e;
  short sStack_51c;
  short sStack_51a;
  short local_518;
  short sStack_516;
  short sStack_514;
  short sStack_512;
  short sStack_510;
  short sStack_50e;
  short sStack_50c;
  short sStack_50a;
  __m128i b7;
  __m128i b6;
  __m128i b5;
  __m128i b4;
  __m128i b3;
  __m128i b2;
  __m128i b1;
  __m128i b0;
  
  uVar1 = *(undefined8 *)in_RDI;
  uVar2 = *(undefined8 *)(in_RDI + 4);
  uVar3 = *(undefined8 *)(in_RDI + 8);
  uVar4 = *(undefined8 *)(in_RDI + 0xc);
  uVar5 = *(undefined8 *)(in_RDI + 0x10);
  uVar6 = *(undefined8 *)(in_RDI + 0x14);
  uVar7 = *(undefined8 *)(in_RDI + 0x18);
  uVar8 = *(undefined8 *)(in_RDI + 0x1c);
  uVar9 = *(undefined8 *)(in_RDI + 0x20);
  uVar10 = *(undefined8 *)(in_RDI + 0x24);
  uVar11 = *(undefined8 *)(in_RDI + 0x28);
  uVar12 = *(undefined8 *)(in_RDI + 0x2c);
  uVar13 = *(undefined8 *)(in_RDI + 0x30);
  uVar14 = *(undefined8 *)(in_RDI + 0x34);
  uVar15 = *(undefined8 *)(in_RDI + 0x38);
  uVar16 = *(undefined8 *)(in_RDI + 0x3c);
  local_518 = (short)uVar1;
  sStack_516 = (short)((ulong)uVar1 >> 0x10);
  sStack_514 = (short)((ulong)uVar1 >> 0x20);
  sStack_512 = (short)((ulong)uVar1 >> 0x30);
  sStack_510 = (short)uVar2;
  sStack_50e = (short)((ulong)uVar2 >> 0x10);
  sStack_50c = (short)((ulong)uVar2 >> 0x20);
  sStack_50a = (short)((ulong)uVar2 >> 0x30);
  local_528 = (short)uVar3;
  sStack_526 = (short)((ulong)uVar3 >> 0x10);
  sStack_524 = (short)((ulong)uVar3 >> 0x20);
  sStack_522 = (short)((ulong)uVar3 >> 0x30);
  sStack_520 = (short)uVar4;
  sStack_51e = (short)((ulong)uVar4 >> 0x10);
  sStack_51c = (short)((ulong)uVar4 >> 0x20);
  sStack_51a = (short)((ulong)uVar4 >> 0x30);
  local_538 = (short)uVar5;
  sStack_536 = (short)((ulong)uVar5 >> 0x10);
  sStack_534 = (short)((ulong)uVar5 >> 0x20);
  sStack_532 = (short)((ulong)uVar5 >> 0x30);
  sStack_530 = (short)uVar6;
  sStack_52e = (short)((ulong)uVar6 >> 0x10);
  sStack_52c = (short)((ulong)uVar6 >> 0x20);
  sStack_52a = (short)((ulong)uVar6 >> 0x30);
  local_548 = (short)uVar7;
  sStack_546 = (short)((ulong)uVar7 >> 0x10);
  sStack_544 = (short)((ulong)uVar7 >> 0x20);
  sStack_542 = (short)((ulong)uVar7 >> 0x30);
  sStack_540 = (short)uVar8;
  sStack_53e = (short)((ulong)uVar8 >> 0x10);
  sStack_53c = (short)((ulong)uVar8 >> 0x20);
  sStack_53a = (short)((ulong)uVar8 >> 0x30);
  local_558 = (short)uVar9;
  sStack_556 = (short)((ulong)uVar9 >> 0x10);
  sStack_554 = (short)((ulong)uVar9 >> 0x20);
  sStack_552 = (short)((ulong)uVar9 >> 0x30);
  sStack_550 = (short)uVar10;
  sStack_54e = (short)((ulong)uVar10 >> 0x10);
  sStack_54c = (short)((ulong)uVar10 >> 0x20);
  sStack_54a = (short)((ulong)uVar10 >> 0x30);
  local_568 = (short)uVar11;
  sStack_566 = (short)((ulong)uVar11 >> 0x10);
  sStack_564 = (short)((ulong)uVar11 >> 0x20);
  sStack_562 = (short)((ulong)uVar11 >> 0x30);
  sStack_560 = (short)uVar12;
  sStack_55e = (short)((ulong)uVar12 >> 0x10);
  sStack_55c = (short)((ulong)uVar12 >> 0x20);
  sStack_55a = (short)((ulong)uVar12 >> 0x30);
  local_578 = (short)uVar13;
  sStack_576 = (short)((ulong)uVar13 >> 0x10);
  sStack_574 = (short)((ulong)uVar13 >> 0x20);
  sStack_572 = (short)((ulong)uVar13 >> 0x30);
  sStack_570 = (short)uVar14;
  sStack_56e = (short)((ulong)uVar14 >> 0x10);
  sStack_56c = (short)((ulong)uVar14 >> 0x20);
  sStack_56a = (short)((ulong)uVar14 >> 0x30);
  local_588 = (short)uVar15;
  sStack_586 = (short)((ulong)uVar15 >> 0x10);
  sStack_584 = (short)((ulong)uVar15 >> 0x20);
  sStack_582 = (short)((ulong)uVar15 >> 0x30);
  sStack_580 = (short)uVar16;
  sStack_57e = (short)((ulong)uVar16 >> 0x10);
  sStack_57c = (short)((ulong)uVar16 >> 0x20);
  sStack_57a = (short)((ulong)uVar16 >> 0x30);
  sVar17 = local_518 + local_528 + local_538 + local_548;
  sVar25 = sStack_516 + sStack_526 + sStack_536 + sStack_546;
  sVar33 = sStack_514 + sStack_524 + sStack_534 + sStack_544;
  sVar41 = sStack_512 + sStack_522 + sStack_532 + sStack_542;
  sVar49 = sStack_510 + sStack_520 + sStack_530 + sStack_540;
  sVar57 = sStack_50e + sStack_51e + sStack_52e + sStack_53e;
  sVar65 = sStack_50c + sStack_51c + sStack_52c + sStack_53c;
  sVar73 = sStack_50a + sStack_51a + sStack_52a + sStack_53a;
  sVar18 = (local_518 - local_528) + (local_538 - local_548);
  sVar26 = (sStack_516 - sStack_526) + (sStack_536 - sStack_546);
  sVar34 = (sStack_514 - sStack_524) + (sStack_534 - sStack_544);
  sVar42 = (sStack_512 - sStack_522) + (sStack_532 - sStack_542);
  sVar50 = (sStack_510 - sStack_520) + (sStack_530 - sStack_540);
  sVar58 = (sStack_50e - sStack_51e) + (sStack_52e - sStack_53e);
  sVar66 = (sStack_50c - sStack_51c) + (sStack_52c - sStack_53c);
  sVar74 = (sStack_50a - sStack_51a) + (sStack_52a - sStack_53a);
  sVar19 = (local_518 + local_528) - (local_538 + local_548);
  sVar27 = (sStack_516 + sStack_526) - (sStack_536 + sStack_546);
  sVar35 = (sStack_514 + sStack_524) - (sStack_534 + sStack_544);
  sVar43 = (sStack_512 + sStack_522) - (sStack_532 + sStack_542);
  sVar51 = (sStack_510 + sStack_520) - (sStack_530 + sStack_540);
  sVar59 = (sStack_50e + sStack_51e) - (sStack_52e + sStack_53e);
  sVar67 = (sStack_50c + sStack_51c) - (sStack_52c + sStack_53c);
  sVar75 = (sStack_50a + sStack_51a) - (sStack_52a + sStack_53a);
  sVar20 = (local_518 - local_528) - (local_538 - local_548);
  sVar28 = (sStack_516 - sStack_526) - (sStack_536 - sStack_546);
  sVar36 = (sStack_514 - sStack_524) - (sStack_534 - sStack_544);
  sVar44 = (sStack_512 - sStack_522) - (sStack_532 - sStack_542);
  sVar52 = (sStack_510 - sStack_520) - (sStack_530 - sStack_540);
  sVar60 = (sStack_50e - sStack_51e) - (sStack_52e - sStack_53e);
  sVar68 = (sStack_50c - sStack_51c) - (sStack_52c - sStack_53c);
  sVar76 = (sStack_50a - sStack_51a) - (sStack_52a - sStack_53a);
  sVar21 = local_558 + local_568 + local_578 + local_588;
  sVar29 = sStack_556 + sStack_566 + sStack_576 + sStack_586;
  sVar37 = sStack_554 + sStack_564 + sStack_574 + sStack_584;
  sVar45 = sStack_552 + sStack_562 + sStack_572 + sStack_582;
  sVar53 = sStack_550 + sStack_560 + sStack_570 + sStack_580;
  sVar61 = sStack_54e + sStack_55e + sStack_56e + sStack_57e;
  sVar69 = sStack_54c + sStack_55c + sStack_56c + sStack_57c;
  sVar77 = sStack_54a + sStack_55a + sStack_56a + sStack_57a;
  sVar22 = (local_558 - local_568) + (local_578 - local_588);
  sVar30 = (sStack_556 - sStack_566) + (sStack_576 - sStack_586);
  sVar38 = (sStack_554 - sStack_564) + (sStack_574 - sStack_584);
  sVar46 = (sStack_552 - sStack_562) + (sStack_572 - sStack_582);
  sVar54 = (sStack_550 - sStack_560) + (sStack_570 - sStack_580);
  sVar62 = (sStack_54e - sStack_55e) + (sStack_56e - sStack_57e);
  sVar70 = (sStack_54c - sStack_55c) + (sStack_56c - sStack_57c);
  sVar78 = (sStack_54a - sStack_55a) + (sStack_56a - sStack_57a);
  sVar23 = (local_558 + local_568) - (local_578 + local_588);
  sVar31 = (sStack_556 + sStack_566) - (sStack_576 + sStack_586);
  sVar39 = (sStack_554 + sStack_564) - (sStack_574 + sStack_584);
  sVar47 = (sStack_552 + sStack_562) - (sStack_572 + sStack_582);
  sVar55 = (sStack_550 + sStack_560) - (sStack_570 + sStack_580);
  sVar63 = (sStack_54e + sStack_55e) - (sStack_56e + sStack_57e);
  sVar71 = (sStack_54c + sStack_55c) - (sStack_56c + sStack_57c);
  sVar79 = (sStack_54a + sStack_55a) - (sStack_56a + sStack_57a);
  sVar24 = (local_558 - local_568) - (local_578 - local_588);
  sVar32 = (sStack_556 - sStack_566) - (sStack_576 - sStack_586);
  sVar40 = (sStack_554 - sStack_564) - (sStack_574 - sStack_584);
  sVar48 = (sStack_552 - sStack_562) - (sStack_572 - sStack_582);
  sVar56 = (sStack_550 - sStack_560) - (sStack_570 - sStack_580);
  sVar64 = (sStack_54e - sStack_55e) - (sStack_56e - sStack_57e);
  sVar72 = (sStack_54c - sStack_55c) - (sStack_56c - sStack_57c);
  sVar80 = (sStack_54a - sStack_55a) - (sStack_56a - sStack_57a);
  if (in_ESI == 0) {
    local_728 = CONCAT22(sVar19 - sVar23,sVar17 + sVar21);
    uStack_720 = CONCAT22(sVar35 - sVar39,sVar33 + sVar37);
    local_748 = CONCAT22(sVar51 - sVar55,sVar49 + sVar53);
    uStack_740 = CONCAT22(sVar67 - sVar71,sVar65 + sVar69);
    local_768 = CONCAT22(sVar20 - sVar24,sVar20 + sVar24);
    uStack_760 = CONCAT22(sVar36 - sVar40,sVar36 + sVar40);
    local_788 = CONCAT22(sVar52 - sVar56,sVar52 + sVar56);
    uStack_780 = CONCAT22(sVar68 - sVar72,sVar68 + sVar72);
    *(ulong *)in_RDI = CONCAT26(sVar19 + sVar23,CONCAT24(sVar17 - sVar21,local_728));
    *(ulong *)(in_RDI + 4) = CONCAT26(sVar18 + sVar22,CONCAT24(sVar18 - sVar22,local_768));
    *(undefined4 *)(in_RDI + 0xc) = (undefined4)b0[0];
    *(uint *)(in_RDI + 0xe) = CONCAT22(sVar27 + sVar31,sVar25 - sVar29);
    *(undefined4 *)(in_RDI + 0x10) = (undefined4)b1[0];
    *(uint *)(in_RDI + 0x12) = CONCAT22(sVar26 + sVar30,sVar26 - sVar30);
    *(ulong *)(in_RDI + 0x10) = CONCAT26(sVar35 + sVar39,CONCAT24(sVar33 - sVar37,uStack_720));
    *(ulong *)(in_RDI + 0x14) = CONCAT26(sVar34 + sVar38,CONCAT24(sVar34 - sVar38,uStack_760));
    *(undefined4 *)(in_RDI + 0x1c) = (undefined4)b2[0];
    *(uint *)(in_RDI + 0x1e) = CONCAT22(sVar43 + sVar47,sVar41 - sVar45);
    *(undefined4 *)(in_RDI + 0x20) = (undefined4)b3[0];
    *(uint *)(in_RDI + 0x22) = CONCAT22(sVar42 + sVar46,sVar42 - sVar46);
    *(ulong *)(in_RDI + 0x20) = CONCAT26(sVar51 + sVar55,CONCAT24(sVar49 - sVar53,local_748));
    *(ulong *)(in_RDI + 0x24) = CONCAT26(sVar50 + sVar54,CONCAT24(sVar50 - sVar54,local_788));
    *(undefined4 *)(in_RDI + 0x2c) = (undefined4)b4[0];
    *(uint *)(in_RDI + 0x2e) = CONCAT22(sVar59 + sVar63,sVar57 - sVar61);
    *(undefined4 *)(in_RDI + 0x30) = (undefined4)b5[0];
    *(uint *)(in_RDI + 0x32) = CONCAT22(sVar58 + sVar62,sVar58 - sVar62);
    *(ulong *)(in_RDI + 0x30) = CONCAT26(sVar67 + sVar71,CONCAT24(sVar65 - sVar69,uStack_740));
    *(ulong *)(in_RDI + 0x34) = CONCAT26(sVar66 + sVar70,CONCAT24(sVar66 - sVar70,uStack_780));
    *(undefined4 *)(in_RDI + 0x3c) = (undefined4)b6[0];
    *(uint *)(in_RDI + 0x3e) = CONCAT22(sVar75 + sVar79,sVar73 - sVar77);
    *(undefined4 *)(in_RDI + 0x40) = (undefined4)b7[0];
    *(uint *)(in_RDI + 0x42) = CONCAT22(sVar74 + sVar78,sVar74 - sVar78);
  }
  else {
    *in_RDI = sVar17 + sVar21;
    in_RDI[1] = sVar25 + sVar29;
    in_RDI[2] = sVar33 + sVar37;
    in_RDI[3] = sVar41 + sVar45;
    in_RDI[4] = sVar49 + sVar53;
    in_RDI[5] = sVar57 + sVar61;
    in_RDI[6] = sVar65 + sVar69;
    in_RDI[7] = sVar73 + sVar77;
    in_RDI[0x38] = sVar18 + sVar22;
    in_RDI[0x39] = sVar26 + sVar30;
    in_RDI[0x3a] = sVar34 + sVar38;
    in_RDI[0x3b] = sVar42 + sVar46;
    in_RDI[0x3c] = sVar50 + sVar54;
    in_RDI[0x3d] = sVar58 + sVar62;
    in_RDI[0x3e] = sVar66 + sVar70;
    in_RDI[0x3f] = sVar74 + sVar78;
    in_RDI[0x18] = sVar19 + sVar23;
    in_RDI[0x19] = sVar27 + sVar31;
    in_RDI[0x1a] = sVar35 + sVar39;
    in_RDI[0x1b] = sVar43 + sVar47;
    in_RDI[0x1c] = sVar51 + sVar55;
    in_RDI[0x1d] = sVar59 + sVar63;
    in_RDI[0x1e] = sVar67 + sVar71;
    in_RDI[0x1f] = sVar75 + sVar79;
    in_RDI[0x20] = sVar20 + sVar24;
    in_RDI[0x21] = sVar28 + sVar32;
    in_RDI[0x22] = sVar36 + sVar40;
    in_RDI[0x23] = sVar44 + sVar48;
    in_RDI[0x24] = sVar52 + sVar56;
    in_RDI[0x25] = sVar60 + sVar64;
    in_RDI[0x26] = sVar68 + sVar72;
    in_RDI[0x27] = sVar76 + sVar80;
    in_RDI[0x10] = sVar17 - sVar21;
    in_RDI[0x11] = sVar25 - sVar29;
    in_RDI[0x12] = sVar33 - sVar37;
    in_RDI[0x13] = sVar41 - sVar45;
    in_RDI[0x14] = sVar49 - sVar53;
    in_RDI[0x15] = sVar57 - sVar61;
    in_RDI[0x16] = sVar65 - sVar69;
    in_RDI[0x17] = sVar73 - sVar77;
    in_RDI[0x30] = sVar18 - sVar22;
    in_RDI[0x31] = sVar26 - sVar30;
    in_RDI[0x32] = sVar34 - sVar38;
    in_RDI[0x33] = sVar42 - sVar46;
    in_RDI[0x34] = sVar50 - sVar54;
    in_RDI[0x35] = sVar58 - sVar62;
    in_RDI[0x36] = sVar66 - sVar70;
    in_RDI[0x37] = sVar74 - sVar78;
    in_RDI[8] = sVar19 - sVar23;
    in_RDI[9] = sVar27 - sVar31;
    in_RDI[10] = sVar35 - sVar39;
    in_RDI[0xb] = sVar43 - sVar47;
    in_RDI[0xc] = sVar51 - sVar55;
    in_RDI[0xd] = sVar59 - sVar63;
    in_RDI[0xe] = sVar67 - sVar71;
    in_RDI[0xf] = sVar75 - sVar79;
    in_RDI[0x28] = sVar20 - sVar24;
    in_RDI[0x29] = sVar28 - sVar32;
    in_RDI[0x2a] = sVar36 - sVar40;
    in_RDI[0x2b] = sVar44 - sVar48;
    in_RDI[0x2c] = sVar52 - sVar56;
    in_RDI[0x2d] = sVar60 - sVar64;
    in_RDI[0x2e] = sVar68 - sVar72;
    in_RDI[0x2f] = sVar76 - sVar80;
  }
  return;
}

Assistant:

static inline void hadamard_col8_sse2(__m128i *in, int iter) {
  __m128i a0 = in[0];
  __m128i a1 = in[1];
  __m128i a2 = in[2];
  __m128i a3 = in[3];
  __m128i a4 = in[4];
  __m128i a5 = in[5];
  __m128i a6 = in[6];
  __m128i a7 = in[7];

  __m128i b0 = _mm_add_epi16(a0, a1);
  __m128i b1 = _mm_sub_epi16(a0, a1);
  __m128i b2 = _mm_add_epi16(a2, a3);
  __m128i b3 = _mm_sub_epi16(a2, a3);
  __m128i b4 = _mm_add_epi16(a4, a5);
  __m128i b5 = _mm_sub_epi16(a4, a5);
  __m128i b6 = _mm_add_epi16(a6, a7);
  __m128i b7 = _mm_sub_epi16(a6, a7);

  a0 = _mm_add_epi16(b0, b2);
  a1 = _mm_add_epi16(b1, b3);
  a2 = _mm_sub_epi16(b0, b2);
  a3 = _mm_sub_epi16(b1, b3);
  a4 = _mm_add_epi16(b4, b6);
  a5 = _mm_add_epi16(b5, b7);
  a6 = _mm_sub_epi16(b4, b6);
  a7 = _mm_sub_epi16(b5, b7);

  if (iter == 0) {
    b0 = _mm_add_epi16(a0, a4);
    b7 = _mm_add_epi16(a1, a5);
    b3 = _mm_add_epi16(a2, a6);
    b4 = _mm_add_epi16(a3, a7);
    b2 = _mm_sub_epi16(a0, a4);
    b6 = _mm_sub_epi16(a1, a5);
    b1 = _mm_sub_epi16(a2, a6);
    b5 = _mm_sub_epi16(a3, a7);

    a0 = _mm_unpacklo_epi16(b0, b1);
    a1 = _mm_unpacklo_epi16(b2, b3);
    a2 = _mm_unpackhi_epi16(b0, b1);
    a3 = _mm_unpackhi_epi16(b2, b3);
    a4 = _mm_unpacklo_epi16(b4, b5);
    a5 = _mm_unpacklo_epi16(b6, b7);
    a6 = _mm_unpackhi_epi16(b4, b5);
    a7 = _mm_unpackhi_epi16(b6, b7);

    b0 = _mm_unpacklo_epi32(a0, a1);
    b1 = _mm_unpacklo_epi32(a4, a5);
    b2 = _mm_unpackhi_epi32(a0, a1);
    b3 = _mm_unpackhi_epi32(a4, a5);
    b4 = _mm_unpacklo_epi32(a2, a3);
    b5 = _mm_unpacklo_epi32(a6, a7);
    b6 = _mm_unpackhi_epi32(a2, a3);
    b7 = _mm_unpackhi_epi32(a6, a7);

    in[0] = _mm_unpacklo_epi64(b0, b1);
    in[1] = _mm_unpackhi_epi64(b0, b1);
    in[2] = _mm_unpacklo_epi64(b2, b3);
    in[3] = _mm_unpackhi_epi64(b2, b3);
    in[4] = _mm_unpacklo_epi64(b4, b5);
    in[5] = _mm_unpackhi_epi64(b4, b5);
    in[6] = _mm_unpacklo_epi64(b6, b7);
    in[7] = _mm_unpackhi_epi64(b6, b7);
  } else {
    in[0] = _mm_add_epi16(a0, a4);
    in[7] = _mm_add_epi16(a1, a5);
    in[3] = _mm_add_epi16(a2, a6);
    in[4] = _mm_add_epi16(a3, a7);
    in[2] = _mm_sub_epi16(a0, a4);
    in[6] = _mm_sub_epi16(a1, a5);
    in[1] = _mm_sub_epi16(a2, a6);
    in[5] = _mm_sub_epi16(a3, a7);
  }
}